

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

raw_problem * baryonyx::make_problem(raw_problem *__return_storage_ptr__,context *ctx,istream *is)

{
  context *ctx_00;
  raw_problem_status rVar1;
  problem_parser p;
  stream_buffer sb;
  undefined1 auStack_1608 [5632];
  
  ctx_00 = (context *)auStack_1608;
  stream_buffer::stream_buffer((stream_buffer *)(auStack_1608 + 0x100),is);
  problem_parser::problem_parser((problem_parser *)auStack_1608);
  rVar1 = parse(ctx_00,(stream_buffer *)(auStack_1608 + 0x100),(problem_parser *)auStack_1608);
  if (rVar1.tag == success) {
    raw_problem::raw_problem(__return_storage_ptr__,(raw_problem *)auStack_1608);
  }
  else {
    __return_storage_ptr__->type = maximize;
    (__return_storage_ptr__->less_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->less_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->vars).values.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->vars).values.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->vars).values.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->objective).value = 0.0;
    (__return_storage_ptr__->equal_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->equal_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->equal_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->greater_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->greater_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->greater_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->less_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->objective).elements.
    super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->objective).elements.
    super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->objective).elements.
    super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->objective).qelements.
    super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->objective).qelements.
    super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->objective).qelements.
    super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->status = rVar1.tag;
  }
  problem_parser::~problem_parser((problem_parser *)auStack_1608);
  return __return_storage_ptr__;
}

Assistant:

raw_problem
make_problem(const context& ctx, std::istream& is) noexcept
{
    stream_buffer sb(is);
    problem_parser p;

    if (auto ret = parse(ctx, sb, p); ret)
        return std::move(p.m_problem);
    else
        return raw_problem(ret.tag);
}